

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ships.cpp
# Opt level: O2

bool validation(Board *board,int row,int col,Ship *ship)

{
  bool bVar1;
  int j;
  uint uVar2;
  uint uVar3;
  
  for (uVar3 = row - 1; (int)uVar3 <= row + 1; uVar3 = uVar3 + 1) {
    for (uVar2 = col - 1; (int)uVar2 <= col + 1; uVar2 = uVar2 + 1) {
      if ((((-1 < (int)uVar3) && (-1 < (int)uVar2)) && ((int)uVar3 < board->row)) &&
         ((int)uVar2 < board->column)) {
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((ulong)uVar2 * 0x20 +
                                 *(long *)&(board->matrix).
                                           super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar3].
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data),"~");
        if (bVar1) goto LAB_00102648;
      }
    }
  }
LAB_00102648:
  return row + 1 < (int)uVar3;
}

Assistant:

bool validation( Board *board, int row, int col, Ship *ship )
{
	/* The loop begins at the left superior diagonal of the coordinate (x - 1, y - 1)
	 * and ends at the left inferior diagonal of the coordinate (x + 1, y + 1)
	 */
    for( int i = row - 1; i <= row + 1; i++ )
    {
        for( int j = col - 1; j <= col + 1; j++ )
        {
            //! If the values exceed the board's borders, they'll be skipped
            if( i < 0 or i > board->row - 1 or j < 0 or j > board->column - 1 )
            {
                continue;
            }
            //! If at least one space is different of water, the position is denied
            if( board->matrix[i][j] != "~" )
            {
                return false;
            }
        }
    }

    //! In the loop's end the position is validated
    return true;
}